

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Vfs_putenv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  void *pvVar1;
  code *pcVar2;
  int iVar3;
  char *pcVar4;
  jx9_value *pjVar5;
  char *pcVar6;
  char *pcVar7;
  anon_union_8_3_18420de5_for_x aVar8;
  char *pcVar9;
  bool bVar10;
  int iLen;
  int local_2c;
  
  if ((0 < nArg) && (((*apArg)->iFlags & 1) != 0)) {
    pcVar4 = jx9_value_to_string(*apArg,&local_2c);
    if (0 < (long)local_2c) {
      pcVar6 = pcVar4 + local_2c;
      bVar10 = true;
      pcVar7 = pcVar4;
      if (*pcVar4 != '=') {
        pcVar9 = (char *)0x0;
        do {
          pcVar7 = pcVar7 + 1;
          bVar10 = pcVar7 < pcVar6;
          if (!bVar10) goto LAB_0013c09d;
        } while (*pcVar7 != '=');
      }
      *pcVar7 = '\0';
      pcVar9 = pcVar7 + 1;
LAB_0013c09d:
      if ((pcVar9 == (char *)0x0) || ((pcVar9 <= pcVar4 || pcVar6 <= pcVar9) || *pcVar4 == '\0')) {
        pjVar5 = pCtx->pRet;
        jx9MemObjRelease(pjVar5);
        (pjVar5->x).rVal = 0.0;
        pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
        if (!bVar10) {
          return 0;
        }
      }
      else {
        jx9_vm_config(pCtx->pVm,9,pcVar4,pcVar9,(ulong)(uint)((int)pcVar6 - (int)pcVar9));
        pvVar1 = pCtx->pFunc->pUserData;
        if ((pvVar1 == (void *)0x0) ||
           (pcVar2 = *(code **)((long)pvVar1 + 0xf8), pcVar2 == (code *)0x0)) {
          jx9_context_throw_error_format
                    (pCtx,2,
                     "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                     (pCtx->pFunc->sName).zString);
          pjVar5 = pCtx->pRet;
          jx9MemObjRelease(pjVar5);
          (pjVar5->x).rVal = 0.0;
        }
        else {
          iVar3 = (*pcVar2)(pcVar4,pcVar9);
          aVar8.iVal._1_7_ = 0;
          aVar8.iVal._0_1_ = iVar3 == 0;
          pjVar5 = pCtx->pRet;
          jx9MemObjRelease(pjVar5);
          pjVar5->x = aVar8;
        }
        pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
      }
      *pcVar7 = '=';
      return 0;
    }
  }
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Vfs_putenv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName, *zValue;
	char *zSettings, *zEnd;
	jx9_vfs *pVfs;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the setting variable */
	zSettings = (char *)jx9_value_to_string(apArg[0], &iLen);
	if( iLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Parse the setting */
	zEnd = &zSettings[iLen];
	zValue = 0;
	zName = zSettings;
	while( zSettings < zEnd ){
		if( zSettings[0] == '=' ){
			/* Null terminate the name */
			zSettings[0] = 0;
			zValue = &zSettings[1];
			break;
		}
		zSettings++;
	}
	/* Install the environment variable in the $_Env array */
	if( zValue == 0 || zName[0] == 0 || zValue >= zEnd || zName >= zValue ){
		/* Invalid settings, retun FALSE */
		jx9_result_bool(pCtx, 0);
		if( zSettings  < zEnd ){
			zSettings[0] = '=';
		}
		return JX9_OK;
	}
	jx9_vm_config(pCtx->pVm, JX9_VM_CONFIG_ENV_ATTR, zName, zValue, (int)(zEnd-zValue));
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xSetenv == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		zSettings[0] = '=';
		return JX9_OK;
	}
	/* Perform the requested operation */
	rc = pVfs->xSetenv(zName, zValue);
	jx9_result_bool(pCtx, rc == JX9_OK );
	zSettings[0] = '=';
	return JX9_OK;
}